

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O3

void __thiscall spvtools::opt::CFG::CFG(CFG *this,Module *module)

{
  pointer puVar1;
  Function *pFVar2;
  pointer puVar3;
  InstructionList *pIVar4;
  Instruction *pIVar5;
  pointer puVar6;
  pointer puVar7;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_48;
  
  this->module_ = module;
  (this->block2structured_succs_)._M_h._M_buckets =
       &(this->block2structured_succs_)._M_h._M_single_bucket;
  (this->block2structured_succs_)._M_h._M_bucket_count = 1;
  (this->block2structured_succs_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->block2structured_succs_)._M_h._M_element_count = 0;
  (this->block2structured_succs_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->block2structured_succs_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->block2structured_succs_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pIVar5 = (Instruction *)operator_new(0x70);
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Instruction::Instruction(pIVar5,module->context_,OpLabel,0,0,&local_48);
  (this->pseudo_entry_block_).function_ = (Function *)0x0;
  (this->pseudo_entry_block_).label_._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = pIVar5;
  pIVar5 = &(this->pseudo_entry_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.
            sentinel_;
  (this->pseudo_entry_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
       (_func_int **)&PTR__Instruction_00b02eb0;
  (this->pseudo_entry_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  unique_id_ = 0;
  (this->pseudo_entry_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  context_ = (IRContext *)0x0;
  *(undefined8 *)
   ((long)&(this->pseudo_entry_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.context_ + 6) = 0;
  (this->pseudo_entry_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  operands_.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->pseudo_entry_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.operands_.
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->pseudo_entry_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.operands_.
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl + 0x10) = (pointer)0x0;
  (this->pseudo_entry_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  dbg_line_insts_.
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->pseudo_entry_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.dbg_line_insts_.
           super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
           ._M_impl + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->pseudo_entry_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.dbg_line_insts_.
           super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
           ._M_impl + 0x10) = (pointer)0x0;
  pIVar4 = &(this->pseudo_entry_block_).insts_;
  (pIVar4->super_IntrusiveList<spvtools::opt::Instruction>).sentinel_.dbg_scope_.lexical_scope_ = 0;
  (pIVar4->super_IntrusiveList<spvtools::opt::Instruction>).sentinel_.dbg_scope_.inlined_at_ = 0;
  (this->pseudo_entry_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = pIVar5;
  (this->pseudo_entry_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = pIVar5;
  (this->pseudo_entry_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.is_sentinel_ = true;
  (this->pseudo_entry_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.
  _vptr_IntrusiveList = (_func_int **)&PTR__InstructionList_00b02f48;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_48);
  pIVar5 = (Instruction *)operator_new(0x70);
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Instruction::Instruction(pIVar5,module->context_,OpLabel,0,0x400000,&local_48);
  (this->pseudo_exit_block_).function_ = (Function *)0x0;
  (this->pseudo_exit_block_).label_._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = pIVar5;
  pIVar5 = &(this->pseudo_exit_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.
            sentinel_;
  (this->pseudo_exit_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
       (_func_int **)&PTR__Instruction_00b02eb0;
  (this->pseudo_exit_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  unique_id_ = 0;
  (this->pseudo_exit_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  context_ = (IRContext *)0x0;
  *(undefined8 *)
   ((long)&(this->pseudo_exit_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.context_ + 6) = 0;
  (this->pseudo_exit_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  operands_.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->pseudo_exit_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.operands_.
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->pseudo_exit_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.operands_.
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl + 0x10) = (pointer)0x0;
  (this->pseudo_exit_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  dbg_line_insts_.
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->pseudo_exit_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.dbg_line_insts_.
           super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
           ._M_impl + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->pseudo_exit_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.dbg_line_insts_.
           super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
           ._M_impl + 0x10) = (pointer)0x0;
  pIVar4 = &(this->pseudo_exit_block_).insts_;
  (pIVar4->super_IntrusiveList<spvtools::opt::Instruction>).sentinel_.dbg_scope_.lexical_scope_ = 0;
  (pIVar4->super_IntrusiveList<spvtools::opt::Instruction>).sentinel_.dbg_scope_.inlined_at_ = 0;
  (this->pseudo_exit_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = pIVar5;
  (this->pseudo_exit_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = pIVar5;
  (this->pseudo_exit_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.is_sentinel_ = true;
  (this->pseudo_exit_block_).insts_.super_IntrusiveList<spvtools::opt::Instruction>.
  _vptr_IntrusiveList = (_func_int **)&PTR__InstructionList_00b02f48;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_48);
  (this->label2preds_)._M_h._M_buckets = &(this->label2preds_)._M_h._M_single_bucket;
  (this->label2preds_)._M_h._M_bucket_count = 1;
  (this->label2preds_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->label2preds_)._M_h._M_element_count = 0;
  (this->label2preds_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->label2preds_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->label2preds_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->id2block_)._M_h._M_buckets = &(this->id2block_)._M_h._M_single_bucket;
  (this->id2block_)._M_h._M_bucket_count = 1;
  (this->id2block_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->id2block_)._M_h._M_element_count = 0;
  (this->id2block_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->id2block_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->id2block_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  puVar1 = (module->functions_).
           super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar7 = (module->functions_).
                super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar1; puVar7 = puVar7 + 1) {
    pFVar2 = (puVar7->_M_t).
             super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
             .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl;
    puVar3 = *(pointer *)
              ((long)&(pFVar2->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
              + 8);
    for (puVar6 = *(pointer *)
                   &(pFVar2->blocks_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                    ._M_impl; puVar6 != puVar3; puVar6 = puVar6 + 1) {
      RegisterBlock(this,(BasicBlock *)
                         (puVar6->_M_t).
                         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                   );
    }
  }
  return;
}

Assistant:

CFG::CFG(Module* module)
    : module_(module),
      pseudo_entry_block_(std::unique_ptr<Instruction>(
          new Instruction(module->context(), spv::Op::OpLabel, 0, 0, {}))),
      pseudo_exit_block_(std::unique_ptr<Instruction>(new Instruction(
          module->context(), spv::Op::OpLabel, 0, kMaxResultId, {}))) {
  for (auto& fn : *module) {
    for (auto& blk : fn) {
      RegisterBlock(&blk);
    }
  }
}